

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3fa embree::OBJMaterial__eval
                 (ISPCOBJMaterial *material,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
                 Vec3fa *wi)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Vec3fa *in_RCX;
  float *in_RDX;
  undefined8 *in_RDI;
  long in_R8;
  undefined8 *in_R9;
  float fVar10;
  float fVar11;
  float fVar12;
  Sample3f refl;
  float Mt;
  float Ms;
  float Md;
  Vec3fa *R;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  vfloat4 c_3;
  vfloat4 b_3;
  vfloat4 a_3;
  float in_stack_fffffffffffff114;
  undefined4 in_stack_fffffffffffff118;
  undefined4 in_stack_fffffffffffff11c;
  float local_ee0;
  float local_ec8;
  float local_ec4;
  float local_ec0;
  float local_ebc;
  float local_eb8;
  float local_eb4;
  float local_eb0;
  float local_eac;
  embree local_e68 [16];
  undefined1 local_e58 [36];
  undefined4 local_e34;
  undefined4 local_e30;
  float local_e2c;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  float local_dfc;
  float local_df8;
  float local_df4;
  undefined8 *local_df0;
  long local_de8;
  float *local_dd8;
  undefined8 *local_db0;
  float local_da0;
  undefined4 local_d9c;
  float local_d98;
  float local_d94;
  float local_d90;
  float local_d8c;
  float local_d88;
  float local_d84;
  float local_d80;
  float local_d7c;
  float local_d78;
  float local_d74;
  float local_d70;
  float local_d6c;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 *local_d38;
  undefined1 *local_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 *local_d18;
  undefined1 *local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 *local_cf8;
  undefined4 local_ce4;
  undefined8 *local_cc0;
  undefined8 *local_cb0;
  undefined4 *local_c88;
  undefined4 *local_c80;
  float *local_c78;
  float local_c70;
  float local_c6c;
  undefined1 *local_c60;
  undefined1 *local_c50;
  undefined8 local_c08;
  undefined8 uStack_c00;
  float *local_bf8;
  float local_bec;
  undefined8 *local_be8;
  float local_bdc;
  undefined8 *local_bd8;
  float local_bd0;
  float local_bcc;
  float *local_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_b90;
  undefined8 *local_b80;
  undefined8 *local_b78;
  undefined1 *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined1 *local_b58;
  undefined8 *local_b50;
  undefined1 *local_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 *local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 *local_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 *local_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f8;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7d0;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  undefined8 *local_7a8;
  undefined8 *local_7a0;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  undefined8 *local_6f0;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 *local_640;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 *local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_150;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 *local_f0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_ce4 = 0;
  local_1d8 = 0;
  local_1e8 = 0;
  uStack_1e4 = 0;
  uStack_1e0 = 0;
  uStack_1dc = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  local_d6c = in_RDX[8];
  local_d70 = in_RDX[9];
  local_eac = local_d6c;
  if (local_d6c < local_d70) {
    local_eac = local_d70;
  }
  local_d78 = in_RDX[10];
  local_d74 = local_eac;
  local_eb0 = local_d78;
  if (local_d78 <= local_eac) {
    local_eb0 = local_eac;
  }
  local_df4 = local_eb0;
  local_d7c = in_RDX[0xc];
  local_d80 = in_RDX[0xd];
  local_eb4 = local_d7c;
  if (local_d7c < local_d80) {
    local_eb4 = local_d80;
  }
  local_d88 = in_RDX[0xe];
  local_d84 = local_eb4;
  local_eb8 = local_d88;
  if (local_d88 <= local_eb4) {
    local_eb8 = local_eb4;
  }
  local_df8 = local_eb8;
  local_d8c = in_RDX[0x10];
  local_d90 = in_RDX[0x11];
  local_ebc = local_d8c;
  if (local_d8c < local_d90) {
    local_ebc = local_d90;
  }
  local_d98 = in_RDX[0x12];
  local_d94 = local_ebc;
  local_ec0 = local_d98;
  if (local_d98 <= local_ebc) {
    local_ec0 = local_ebc;
  }
  local_dfc = local_ec0;
  if (0.0 < local_eb0) {
    local_cf8 = (undefined8 *)(in_R8 + 0x40);
    local_b80 = &local_d08;
    uVar2 = *in_R9;
    uVar3 = in_R9[1];
    uVar4 = *local_cf8;
    uVar5 = *(undefined8 *)(in_R8 + 0x48);
    local_58._0_4_ = (float)uVar2;
    local_58._4_4_ = (float)((ulong)uVar2 >> 0x20);
    uStack_50._0_4_ = (float)uVar3;
    uStack_50._4_4_ = (float)((ulong)uVar3 >> 0x20);
    local_68._0_4_ = (float)uVar4;
    local_68._4_4_ = (float)((ulong)uVar4 >> 0x20);
    uStack_60._0_4_ = (float)uVar5;
    uStack_60._4_4_ = (float)((ulong)uVar5 >> 0x20);
    local_168 = (float)local_58 * (float)local_68;
    local_5d8 = local_58._4_4_ * local_68._4_4_;
    local_4b8 = (float)uStack_50 * (float)uStack_60;
    fStack_15c = uStack_50._4_4_ * uStack_60._4_4_;
    local_908 = CONCAT44(local_5d8,local_168);
    uStack_900 = CONCAT44(fStack_15c,local_4b8);
    local_8f8 = &local_ae8;
    local_8b8 = &local_af8;
    local_6b8 = CONCAT44(local_5d8,local_5d8);
    uStack_6b0 = CONCAT44(local_5d8,local_5d8);
    local_878 = &local_b08;
    local_4d8 = CONCAT44(local_4b8,local_4b8);
    uStack_4d0 = CONCAT44(local_4b8,local_4b8);
    local_748 = &local_b28;
    local_708 = local_168 + local_5d8;
    fStack_704 = local_5d8 + local_5d8;
    fStack_700 = local_4b8 + local_5d8;
    fStack_6fc = fStack_15c + local_5d8;
    local_338 = CONCAT44(fStack_704,local_708);
    uStack_330 = CONCAT44(fStack_6fc,fStack_700);
    local_740 = &local_b18;
    local_e2c = local_708 + local_4b8;
    fStack_734 = fStack_704 + local_4b8;
    fStack_730 = fStack_700 + local_4b8;
    fStack_72c = fStack_6fc + local_4b8;
    local_ac8 = CONCAT44(fStack_734,local_e2c);
    uStack_ac0 = CONCAT44(fStack_72c,fStack_730);
    local_c60 = &zero;
    local_e30 = 0;
    local_c50 = &one;
    local_e34 = 0x3f800000;
    local_c78 = &local_e2c;
    local_c80 = &local_e30;
    local_c88 = &local_e34;
    local_bd0 = 1.0;
    local_ec4 = local_bd0;
    if (local_e2c < 1.0) {
      local_ec4 = local_e2c;
    }
    local_c70 = 0.0;
    local_c6c = local_ec4;
    local_ec8 = local_c70;
    if (0.0 <= local_ec4) {
      local_ec8 = local_ec4;
    }
    local_bec = local_ec8 * 0.31830987;
    local_bf8 = in_RDX + 8;
    local_be8 = &local_e28;
    local_bd8 = &local_c08;
    local_18 = CONCAT44(local_bec,local_bec);
    uStack_10 = CONCAT44(local_bec,local_bec);
    local_bb0 = &local_e28;
    local_bb8 = &local_c08;
    uVar6 = *(undefined8 *)local_bf8;
    uVar7 = *(undefined8 *)(in_RDX + 10);
    local_28._0_4_ = (float)uVar6;
    local_28._4_4_ = (float)((ulong)uVar6 >> 0x20);
    uStack_20._0_4_ = (float)uVar7;
    uStack_20._4_4_ = (float)((ulong)uVar7 >> 0x20);
    local_128 = local_bec * (float)local_28;
    fStack_124 = local_bec * local_28._4_4_;
    fStack_120 = local_bec * (float)uStack_20;
    fStack_11c = local_bec * uStack_20._4_4_;
    local_110 = &local_e28;
    local_268 = CONCAT44(fStack_124,local_128);
    uStack_260 = CONCAT44(fStack_11c,fStack_120);
    local_cb0 = &local_e18;
    local_cc0 = &local_e28;
    uVar8 = *in_RDI;
    uVar9 = in_RDI[1];
    local_258._0_4_ = (float)uVar8;
    local_258._4_4_ = (float)((ulong)uVar8 >> 0x20);
    uStack_250._0_4_ = (float)uVar9;
    uStack_250._4_4_ = (float)((ulong)uVar9 >> 0x20);
    local_108 = (float)local_258 + local_128;
    fStack_104 = local_258._4_4_ + fStack_124;
    fStack_100 = (float)uStack_250 + fStack_120;
    fStack_fc = uStack_250._4_4_ + fStack_11c;
    local_f0 = &local_e18;
    local_e18 = CONCAT44(fStack_104,local_108);
    uStack_e10 = CONCAT44(fStack_fc,fStack_100);
    local_db0 = &local_e18;
    *in_RDI = local_e18;
    in_RDI[1] = uStack_e10;
    local_bdc = local_bec;
    local_bcc = local_e2c;
    local_bc0 = local_bf8;
    local_b90 = local_cf8;
    local_ad0 = local_b80;
    local_8c0 = local_8f8;
    local_880 = local_8f8;
    local_750 = local_878;
    local_738 = local_e2c;
    local_728 = local_740;
    local_720 = local_8b8;
    local_718 = local_8f8;
    local_710 = local_748;
    local_6f0 = local_748;
    local_6d0 = local_740;
    local_6c8 = local_8f8;
    local_6c0 = local_8b8;
    local_6a0 = local_8b8;
    fStack_5d4 = local_5d8;
    fStack_5d0 = local_5d8;
    fStack_5cc = local_5d8;
    local_598 = local_908;
    uStack_590 = uStack_900;
    local_570 = local_8f8;
    local_568 = local_8b8;
    local_560 = local_8f8;
    local_558 = local_878;
    local_550 = local_748;
    local_4e8 = local_8f8;
    local_4e0 = local_878;
    local_4c0 = local_878;
    fStack_4b4 = local_4b8;
    fStack_4b0 = local_4b8;
    fStack_4ac = local_4b8;
    local_4a8 = local_908;
    uStack_4a0 = uStack_900;
    local_490 = local_8f8;
    local_368 = local_6b8;
    uStack_360 = uStack_6b0;
    local_358 = local_908;
    uStack_350 = uStack_900;
    local_348 = local_4d8;
    uStack_340 = uStack_4d0;
    local_258 = uVar8;
    uStack_250 = uVar9;
    local_228 = local_bec;
    fStack_224 = local_bec;
    fStack_220 = local_bec;
    fStack_21c = local_bec;
    local_218 = local_bec;
    fStack_164 = local_5d8;
    fStack_160 = local_4b8;
    local_150 = local_b80;
    local_68 = uVar4;
    uStack_60 = uVar5;
    local_58 = uVar2;
    uStack_50 = uVar3;
    local_28 = uVar6;
    uStack_20 = uVar7;
    local_e28 = local_268;
    uStack_e20 = uStack_260;
    local_d08 = local_908;
    uStack_d00 = uStack_900;
    local_c08 = local_18;
    uStack_c00 = uStack_10;
    local_b28 = local_338;
    uStack_b20 = uStack_330;
    local_b18 = local_ac8;
    uStack_b10 = uStack_ac0;
    local_b08 = local_4d8;
    uStack_b00 = uStack_4d0;
    local_af8 = local_6b8;
    uStack_af0 = uStack_6b0;
    local_ae8 = local_908;
    uStack_ae0 = uStack_900;
  }
  if (0.0 < local_eb8) {
    local_df0 = in_R9;
    local_de8 = in_R8;
    local_dd8 = in_RDX;
    reflect(local_e68,in_RCX,(Vec3fa *)(in_R8 + 0x40));
    make_Sample3f((Vec3fa *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
                  in_stack_fffffffffffff114);
    local_d18 = local_df0;
    local_b68 = &local_d28;
    local_b78 = local_df0;
    uVar2 = *local_df0;
    uVar3 = local_df0[1];
    local_78 = (float)local_e58._0_8_;
    fStack_74 = SUB84(local_e58._0_8_,4);
    fStack_70 = (float)local_e58._8_8_;
    fStack_6c = SUB84(local_e58._8_8_,4);
    local_88._0_4_ = (float)uVar2;
    local_88._4_4_ = (float)((ulong)uVar2 >> 0x20);
    uStack_80._0_4_ = (float)uVar3;
    uStack_80._4_4_ = (float)((ulong)uVar3 >> 0x20);
    local_188 = local_78 * (float)local_88;
    local_5e8 = fStack_74 * local_88._4_4_;
    local_458 = fStack_70 * (float)uStack_80;
    fStack_17c = fStack_6c * uStack_80._4_4_;
    local_928 = CONCAT44(local_5e8,local_188);
    uStack_920 = CONCAT44(fStack_17c,local_458);
    local_910 = &local_a78;
    local_8c8 = &local_a88;
    local_688 = CONCAT44(local_5e8,local_5e8);
    uStack_680 = CONCAT44(local_5e8,local_5e8);
    local_888 = &local_a98;
    local_478 = CONCAT44(local_458,local_458);
    uStack_470 = CONCAT44(local_458,local_458);
    local_7a8 = &local_ab8;
    local_768 = local_188 + local_5e8;
    fStack_764 = local_5e8 + local_5e8;
    fStack_760 = local_458 + local_5e8;
    fStack_75c = fStack_17c + local_5e8;
    local_2f8 = CONCAT44(fStack_764,local_768);
    uStack_2f0 = CONCAT44(fStack_75c,fStack_760);
    local_7a0 = &local_aa8;
    local_798 = local_768 + local_458;
    fStack_794 = fStack_764 + local_458;
    fStack_790 = fStack_760 + local_458;
    fStack_78c = fStack_75c + local_458;
    local_a58 = CONCAT44(fStack_794,local_798);
    uStack_a50 = CONCAT44(fStack_78c,fStack_790);
    if (0.0 < local_798) {
      fVar1 = *local_dd8;
      local_b30 = &one_over_two_pi;
      local_d30 = local_e58;
      local_d38 = local_df0;
      local_b50 = &local_d48;
      local_b60 = local_df0;
      uVar4 = *local_df0;
      uVar5 = local_df0[1];
      local_a8._0_4_ = (float)uVar4;
      local_a8._4_4_ = (float)((ulong)uVar4 >> 0x20);
      uStack_a0._0_4_ = (float)uVar5;
      uStack_a0._4_4_ = (float)((ulong)uVar5 >> 0x20);
      local_1a8 = local_78 * (float)local_a8;
      local_5f8 = fStack_74 * local_a8._4_4_;
      local_3f8 = fStack_70 * (float)uStack_a0;
      fStack_19c = fStack_6c * uStack_a0._4_4_;
      local_948 = CONCAT44(local_5f8,local_1a8);
      uStack_940 = CONCAT44(fStack_19c,local_3f8);
      local_930 = &local_a08;
      local_8d8 = &local_a18;
      local_658 = CONCAT44(local_5f8,local_5f8);
      uStack_650 = CONCAT44(local_5f8,local_5f8);
      local_898 = &local_a28;
      local_418 = CONCAT44(local_3f8,local_3f8);
      uStack_410 = CONCAT44(local_3f8,local_3f8);
      local_808 = &local_a48;
      local_7c8 = local_1a8 + local_5f8;
      fStack_7c4 = local_5f8 + local_5f8;
      fStack_7c0 = local_3f8 + local_5f8;
      fStack_7bc = fStack_19c + local_5f8;
      local_2b8 = CONCAT44(fStack_7c4,local_7c8);
      uStack_2b0 = CONCAT44(fStack_7bc,fStack_7c0);
      local_800 = &local_a38;
      local_da0 = local_7c8 + local_3f8;
      fStack_7f4 = fStack_7c4 + local_3f8;
      fStack_7f0 = fStack_7c0 + local_3f8;
      fStack_7ec = fStack_7bc + local_3f8;
      local_9e8 = CONCAT44(fStack_7f4,local_da0);
      uStack_9e0 = CONCAT44(fStack_7ec,fStack_7f0);
      local_d9c = 0x2edbe6ff;
      local_ee0 = local_da0;
      if (local_da0 <= 1e-10) {
        local_ee0 = 1e-10;
      }
      local_d10 = local_e58;
      local_b70 = local_e58;
      local_b58 = local_d30;
      local_a60 = local_b68;
      local_9f0 = local_b50;
      local_8e0 = local_930;
      local_8d0 = local_910;
      local_8a0 = local_930;
      local_890 = local_910;
      local_810 = local_898;
      local_7f8 = local_da0;
      local_7e8 = local_800;
      local_7e0 = local_8d8;
      local_7d8 = local_930;
      local_7d0 = local_808;
      local_7b8 = local_808;
      local_7b0 = local_888;
      local_788 = local_7a0;
      local_780 = local_8c8;
      local_778 = local_910;
      local_770 = local_7a8;
      local_758 = local_7a8;
      local_6e0 = local_800;
      local_6d8 = local_7a0;
      local_698 = local_910;
      local_690 = local_8c8;
      local_670 = local_8c8;
      local_668 = local_930;
      local_660 = local_8d8;
      local_640 = local_8d8;
      fStack_5f4 = local_5f8;
      fStack_5f0 = local_5f8;
      fStack_5ec = local_5f8;
      fStack_5e4 = local_5e8;
      fStack_5e0 = local_5e8;
      fStack_5dc = local_5e8;
      local_5b8 = local_948;
      uStack_5b0 = uStack_940;
      local_5a8 = local_928;
      uStack_5a0 = uStack_920;
      local_580 = local_930;
      local_578 = local_910;
      local_548 = local_8c8;
      local_540 = local_910;
      local_538 = local_888;
      local_530 = local_7a8;
      local_528 = local_8d8;
      local_520 = local_930;
      local_518 = local_898;
      local_510 = local_808;
      local_488 = local_910;
      local_480 = local_888;
      local_460 = local_888;
      fStack_454 = local_458;
      fStack_450 = local_458;
      fStack_44c = local_458;
      local_448 = local_928;
      uStack_440 = uStack_920;
      local_430 = local_910;
      local_428 = local_930;
      local_420 = local_898;
      local_400 = local_898;
      fStack_3f4 = local_3f8;
      fStack_3f0 = local_3f8;
      fStack_3ec = local_3f8;
      local_3e8 = local_948;
      uStack_3e0 = uStack_940;
      local_3d0 = local_930;
      local_328 = local_688;
      uStack_320 = uStack_680;
      local_318 = local_928;
      uStack_310 = uStack_920;
      local_308 = local_478;
      uStack_300 = uStack_470;
      local_2e8 = local_658;
      uStack_2e0 = uStack_650;
      local_2d8 = local_948;
      uStack_2d0 = uStack_940;
      local_2c8 = local_418;
      uStack_2c0 = uStack_410;
      fStack_1a4 = local_5f8;
      fStack_1a0 = local_3f8;
      local_190 = local_b50;
      fStack_184 = local_5e8;
      fStack_180 = local_458;
      local_170 = local_b68;
      local_a8 = uVar4;
      uStack_a0 = uVar5;
      local_88 = uVar2;
      uStack_80 = uVar3;
      local_d48 = local_948;
      uStack_d40 = uStack_940;
      local_d28 = local_928;
      uStack_d20 = uStack_920;
      local_ab8 = local_2f8;
      uStack_ab0 = uStack_2f0;
      local_aa8 = local_a58;
      uStack_aa0 = uStack_a50;
      local_a98 = local_478;
      uStack_a90 = uStack_470;
      local_a88 = local_688;
      uStack_a80 = uStack_680;
      local_a78 = local_928;
      uStack_a70 = uStack_920;
      local_a48 = local_2b8;
      uStack_a40 = uStack_2b0;
      local_a38 = local_9e8;
      uStack_a30 = uStack_9e0;
      local_a28 = local_418;
      uStack_a20 = uStack_410;
      local_a18 = local_658;
      uStack_a10 = uStack_650;
      local_a08 = local_948;
      uStack_a00 = uStack_940;
      fVar10 = powf(local_ee0,*local_dd8);
      local_b8 = (float)*local_df0;
      fStack_b4 = (float)((ulong)*local_df0 >> 0x20);
      fStack_b0 = (float)local_df0[1];
      local_c8 = (float)*(undefined8 *)(local_de8 + 0x40);
      fStack_c4 = (float)((ulong)*(undefined8 *)(local_de8 + 0x40) >> 0x20);
      fStack_c0 = (float)*(undefined8 *)(local_de8 + 0x48);
      fVar11 = local_b8 * local_c8 + fStack_b4 * fStack_c4 + fStack_b0 * fStack_c0;
      fVar12 = 1.0;
      if (fVar11 < 1.0) {
        fVar12 = fVar11;
      }
      if (fVar12 < 0.0) {
        fVar12 = 0.0;
      }
      fVar12 = (fVar1 + 2.0) * 0.15915494 * fVar10 * fVar12;
      local_48 = (float)*(undefined8 *)(local_dd8 + 0xc);
      fStack_44 = (float)((ulong)*(undefined8 *)(local_dd8 + 0xc) >> 0x20);
      fStack_40 = (float)*(undefined8 *)(local_dd8 + 0xe);
      fStack_3c = (float)((ulong)*(undefined8 *)(local_dd8 + 0xe) >> 0x20);
      local_238 = (float)*in_RDI;
      fStack_234 = (float)((ulong)*in_RDI >> 0x20);
      fStack_230 = (float)in_RDI[1];
      fStack_22c = (float)((ulong)in_RDI[1] >> 0x20);
      *in_RDI = CONCAT44(fStack_234 + fVar12 * fStack_44,local_238 + fVar12 * local_48);
      in_RDI[1] = CONCAT44(fStack_22c + fVar12 * fStack_3c,fStack_230 + fVar12 * fStack_40);
    }
  }
  return (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT416((uint)local_dfc);
}

Assistant:

Vec3fa OBJMaterial__eval(ISPCOBJMaterial* material, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Vec3fa R = Vec3fa(0.0f);
  const float Md = max(max(brdf.Kd.x,brdf.Kd.y),brdf.Kd.z);
  const float Ms = max(max(brdf.Ks.x,brdf.Ks.y),brdf.Ks.z);
  const float Mt = max(max(brdf.Kt.x,brdf.Kt.y),brdf.Kt.z);
  if (Md > 0.0f) {
    R = R + (1.0f/float(M_PI)) * clamp(dot(wi,dg.Ns)) * brdf.Kd;
  }
  if (Ms > 0.0f) {
    const Sample3f refl = make_Sample3f(reflect(wo,dg.Ns),1.0f);
    if (dot(refl.v,wi) > 0.0f)
      R = R + (brdf.Ns+2) * float(one_over_two_pi) * powf(max(1e-10f,dot(refl.v,wi)),brdf.Ns) * clamp(dot(wi,dg.Ns)) * brdf.Ks;
  }
  if (Mt > 0.0f) {
  }
  return R;
}